

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

WriteThirdPartyDescriptorResult * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::writeThirdPartyDescriptor
          (WriteThirdPartyDescriptorResult *__return_storage_ptr__,RpcClient *this,
          Connection *provider,Connection *recipient,Builder contact)

{
  uint *puVar1;
  RpcConnectionState *pRVar2;
  long *plVar3;
  Question *pQVar4;
  QuestionRef *pQVar5;
  undefined4 *puVar6;
  Refcounted *refcounted_1;
  QuestionRef *pQVar7;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> otherMsg;
  QuestionId questionId;
  Builder provide;
  Builder result;
  undefined8 *local_148;
  long *local_140;
  WriteThirdPartyDescriptorResult *local_138;
  QuestionId local_12c;
  undefined1 local_128 [32];
  StructBuilder local_108;
  Connection *local_e0;
  SegmentBuilder *local_d8;
  CapTableBuilder *pCStack_d0;
  WirePointer *local_c8;
  StructBuilder local_b8;
  PointerBuilder local_88;
  SegmentBuilder *local_70;
  CapTableBuilder *pCStack_68;
  WirePointer *local_60;
  StructBuilder local_58;
  
  local_138 = __return_storage_ptr__;
  local_e0 = recipient;
  pQVar4 = anon_unknown_18::
           ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::
           nextHigh(&((this->connectionState).ptr)->questions,&local_12c);
  pQVar4->isAwaitingReturn = false;
  pRVar2 = (this->connectionState).ptr;
  pQVar5 = (QuestionRef *)operator_new(0x38);
  (pQVar5->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_006ce258
  ;
  puVar1 = &(pRVar2->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  (pQVar5->connectionState).ptr.disposer = &(pRVar2->super_Refcounted).super_Disposer;
  (pQVar5->connectionState).ptr.ptr = pRVar2;
  pQVar5->id = local_12c;
  (pQVar5->fulfiller).ptr.disposer = (Disposer *)0x0;
  (pQVar5->fulfiller).ptr.ptr =
       (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
        *)0x0;
  (pQVar5->super_Refcounted).refcount = 1;
  (pQVar4->selfRef).ptr = pQVar5;
  (**provider->_vptr_Connection)(&local_148,provider,0x26);
  (**(code **)*local_140)(&local_70);
  local_128._16_8_ = local_60;
  local_128._0_8_ = local_70;
  local_128._8_8_ = pCStack_68;
  PointerBuilder::initStruct(&local_108,(PointerBuilder *)local_128,(StructSize)0x10001);
  *(undefined2 *)local_108.data = 10;
  local_128._0_8_ = local_108.segment;
  local_128._8_8_ = local_108.capTable;
  local_128._16_8_ = local_108.pointers;
  PointerBuilder::initStruct(&local_b8,(PointerBuilder *)local_128,(StructSize)0x20001);
  *(QuestionId *)local_b8.data = local_12c;
  local_108.segment = local_b8.segment;
  local_108.capTable = local_b8.capTable;
  local_108.data = local_b8.pointers;
  PointerBuilder::initStruct(&local_58,(PointerBuilder *)&local_108,(StructSize)0x10001);
  (*(this->super_ClientHook)._vptr_ClientHook[10])(local_128,this);
  if ((QuestionRef *)local_128._8_8_ == (QuestionRef *)0x0) {
    local_c8 = contact.builder.pointer;
    local_d8 = contact.builder.segment;
    pCStack_d0 = contact.builder.capTable;
    local_88.pointer = local_b8.pointers + 1;
    local_88.segment = local_b8.segment;
    local_88.capTable = local_b8.capTable;
    PointerBuilder::clear(&local_88);
    (*local_e0->_vptr_Connection[7])(local_e0,provider);
    (**(code **)(*local_140 + 0x10))();
    (*(this->super_ClientHook)._vptr_ClientHook[4])(&local_108,this);
    local_128._0_4_ = 1;
    local_128._8_8_ = pQVar5;
    local_128._16_8_ = pQVar5;
    puVar6 = (undefined4 *)operator_new(0x18);
    *puVar6 = 1;
    *(QuestionRef **)(puVar6 + 2) = pQVar5;
    *(QuestionRef **)(puVar6 + 4) = pQVar5;
    local_128._16_8_ = (WirePointer *)0x0;
    local_108.data =
         &kj::_::HeapDisposer<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo>::instance;
    local_138->tag = 1;
    *(SegmentBuilder **)&local_138->field_1 = local_108.segment;
    *(CapTableBuilder **)((long)&local_138->field_1 + 8) = local_108.capTable;
    local_108.capTable = (CapTableBuilder *)0x0;
    *(undefined8 **)((long)&local_138->field_1 + 0x10) =
         &kj::_::HeapDisposer<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo>::instance;
    *(undefined4 **)((long)&local_138->field_1 + 0x18) = puVar6;
    local_108.pointers = (WirePointer *)0x0;
    kj::
    OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>_>
    ::destroy((OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>_>
               *)local_128);
    pQVar7 = (QuestionRef *)0x0;
  }
  else {
    local_138->tag = 2;
    *(undefined8 *)&local_138->field_1 = local_128._0_8_;
    *(undefined8 *)((long)&local_138->field_1 + 8) = local_128._8_8_;
    pQVar7 = pQVar5;
  }
  plVar3 = local_140;
  if (local_140 != (long *)0x0) {
    local_140 = (long *)0x0;
    (**(code **)*local_148)(local_148,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if (pQVar7 != (QuestionRef *)0x0) {
    (**(pQVar5->super_Refcounted).super_Disposer._vptr_Disposer)
              (pQVar5,(pQVar7->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                      (long)&(pQVar7->super_Refcounted).super_Disposer._vptr_Disposer);
  }
  return local_138;
}

Assistant:

virtual WriteThirdPartyDescriptorResult writeThirdPartyDescriptor(
          VatNetworkBase::Connection& provider,
          VatNetworkBase::Connection& recipient,
          AnyPointer::Builder contact) {
      // Called to fill in a ThirdPartyCapDescriptor when sending this capability to a different
      // connection.
      //
      // `provider` is this object's backing connection; the caller has already verified it is
      // currently connected. (Calling connectionState->tryGetConnection() would return the same
      // object.)
      //
      // `recipient` is the connection receiving the ThirdPartyCapDescriptor.
      //
      // `contact` is the ThirdPartyToContact which goes in the descriptor.
      //
      // Returns the ClientHook which should be used as the "vine". This needs to be callable as
      // a stand-in for the object. It also needs to hold open the `Provide` operation until the
      // returned reference is dropped. Note that `addRef()`s on the returned reference do NOT have
      // to hold open the Provide; the Provide can be held open by an attachment on the ref itself.
      //
      // The default implementation of this method is appropriate most of the time. It is
      // overridded for the specific case of `DeferredThirdPartyClient`.

      // Send `Provide` message to our connection.
      QuestionId questionId;
      auto& question = connectionState->questions.nextHigh(questionId);
      question.isAwaitingReturn = false;  // No Return needed
      auto questionRef = kj::refcounted<QuestionRef>(*connectionState, questionId, kj::none);
      question.selfRef = *questionRef;

      auto otherMsg = provider.newOutgoingMessage(messageSizeHint<rpc::Provide>() + 32);
      auto provide = otherMsg->getBody().initAs<rpc::Message>().initProvide();
      provide.setQuestionId(questionId);
      KJ_IF_SOME(redirect, writeTarget(provide.initTarget())) {
        // Oops, this capability was redirected. This *shouldn't* happen since the immediate
        // caller of writeThirdPartyDescriptor() would have already followed redirects, but as it
        // happens, if we simply return the redirect here (without filling in `contact`), we are
        // honoring our contract.
        return kj::mv(redirect);
      }
      recipient.introduceTo(provider, contact, provide.initRecipient());
      otherMsg->send();

      return VineToExport {
        .vine = addRef(),
        .vineInfo = kj::heap(VineInfo { .info = kj::mv(questionRef) })
      };
    }